

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::ExeName::parse
          (InternalParseResult *__return_storage_ptr__,ExeName *this,string *param_1,
          TokenStream *tokens)

{
  ParseState local_58;
  TokenStream *local_28;
  TokenStream *tokens_local;
  string *param_1_local;
  ExeName *this_local;
  
  local_28 = tokens;
  tokens_local = (TokenStream *)param_1;
  param_1_local = (string *)this;
  this_local = (ExeName *)__return_storage_ptr__;
  Detail::ParseState::ParseState(&local_58,NoMatch,tokens);
  Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
            (__return_storage_ptr__,&local_58);
  Detail::ParseState::~ParseState(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult
            ExeName::parse(std::string const&,
                           Detail::TokenStream const& tokens) const {
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, tokens));
        }